

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void jmp_far(PDISASM pMyDisasm)

{
  OPTYPE *pOVar1;
  REGISTERTYPE *pRVar2;
  Int64 *pIVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  UInt8 UVar11;
  UInt8 UVar12;
  UInt8 UVar13;
  int iVar14;
  size_t sVar15;
  char *pcVar16;
  ulong uVar17;
  bool bVar18;
  long lStack_30;
  
  if ((pMyDisasm->Reserved_).Architecture == 0x40) {
    failDecode(pMyDisasm);
    return;
  }
  (pMyDisasm->Instruction).Category = 0x10006;
  (pMyDisasm->Instruction).BranchType = 0xb;
  pOVar1 = &pMyDisasm->Operand1;
  (pMyDisasm->Operand1).AccessMode = 1;
  pcVar16 = (pMyDisasm->Instruction).Mnemonic;
  bVar18 = (pMyDisasm->Reserved_).SYNTAX_ != 0x400;
  if (bVar18) {
    builtin_strncpy(pcVar16,"jmp far",8);
  }
  else {
    builtin_strncpy(pcVar16,"ljmp",5);
    pOVar1->OpMnemonic[0] = '$';
    pOVar1->OpMnemonic[1] = '\0';
  }
  uVar17 = (ulong)!bVar18;
  if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
    iVar14 = Security(7,pMyDisasm);
    if (iVar14 == 0) {
      return;
    }
    lStack_30 = 5;
  }
  else {
    iVar14 = Security(5,pMyDisasm);
    if (iVar14 == 0) {
      return;
    }
    lStack_30 = 3;
  }
  uVar4 = *(ushort *)((pMyDisasm->Reserved_).EIP_ + lStack_30);
  sVar15 = CopyFormattedNumber(pMyDisasm,pOVar1->OpMnemonic + uVar17,"%.4X",(ulong)uVar4);
  pcVar16 = pOVar1->OpMnemonic + sVar15 + uVar17;
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    builtin_strncpy(pOVar1->OpMnemonic + sVar15 + uVar17," , $",5);
    lStack_30 = 4;
  }
  else {
    pcVar16[2] = '\0';
    pcVar16[0] = ' ';
    pcVar16[1] = ':';
    lStack_30 = 3;
  }
  uVar5 = *(uint *)((pMyDisasm->Reserved_).EIP_ + 1);
  uVar6 = uVar5 & 0xffff;
  if ((pMyDisasm->Reserved_).OperandSize != 0x10) {
    uVar6 = uVar5;
  }
  CopyFormattedNumber(pMyDisasm,pcVar16 + lStack_30,"%.8X",(ulong)uVar6);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).OperandSize == 0x20) * 2 + 5;
  (pMyDisasm->Instruction).AddrValue = (ulong)uVar4 * 0x10 + (ulong)uVar6;
  pRVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar2->type = (byte)pRVar2->type | 0x20;
  pIVar3 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar3 = (byte)*pIVar3 | 1;
  UVar7 = EFLAGS_TABLE[0x33].SF_;
  UVar8 = EFLAGS_TABLE[0x33].ZF_;
  UVar9 = EFLAGS_TABLE[0x33].AF_;
  UVar10 = EFLAGS_TABLE[0x33].PF_;
  UVar11 = EFLAGS_TABLE[0x33].CF_;
  UVar12 = EFLAGS_TABLE[0x33].TF_;
  UVar13 = EFLAGS_TABLE[0x33].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x33].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar7;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar8;
  (pMyDisasm->Instruction).Flags.AF_ = UVar9;
  (pMyDisasm->Instruction).Flags.PF_ = UVar10;
  (pMyDisasm->Instruction).Flags.CF_ = UVar11;
  (pMyDisasm->Instruction).Flags.TF_ = UVar12;
  (pMyDisasm->Instruction).Flags.IF_ = UVar13;
  UVar7 = EFLAGS_TABLE[0x33].NT_;
  UVar8 = EFLAGS_TABLE[0x33].RF_;
  UVar9 = EFLAGS_TABLE[0x33].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x33].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar7;
  (pMyDisasm->Instruction).Flags.RF_ = UVar8;
  (pMyDisasm->Instruction).Flags.alignment = UVar9;
  return;
}

Assistant:

void __bea_callspec__ jmp_far(PDISASM pMyDisasm)
{
    UInt32 MyNumber;
    UInt64 MyAddress;
    size_t i = 0;
    if (GV.Architecture == 64) {
        failDecode(pMyDisasm);
    }
    else {
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+CONTROL_TRANSFER;
        pMyDisasm->Instruction.BranchType = JmpType;
        pMyDisasm->Operand1.AccessMode = READ;
        if (GV.SYNTAX_ == ATSyntax) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "ljmp");
            #endif
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic,"\x24");
            #endif
            i++;
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "jmp far");
            #endif
        }
        if (GV.OperandSize ==32) {
            if (!Security(7, pMyDisasm)) return;
            MyNumber = *((UInt16*) (GV.EIP_+5));
            #ifndef BEA_LIGHT_DISASSEMBLY
               i += CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand1.OpMnemonic+i, "%.4X",(Int64) MyNumber);
            #endif
        }
        else {
            if (!Security(5, pMyDisasm)) return;
            MyNumber = *((UInt16*) (GV.EIP_+3));
            #ifndef BEA_LIGHT_DISASSEMBLY
               i += CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand1.OpMnemonic+i, "%.4X",(Int64) MyNumber);
            #endif
        }
        if (GV.SYNTAX_ == ATSyntax) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic+i, " , \x24");
            #endif
            i+=4;
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic+i, " :");
            #endif
            i+=3;
        }
        MyAddress = MyNumber*16;
        MyNumber = *((UInt32*) (GV.EIP_+1));
        if (GV.OperandSize == 16) {
            MyNumber = MyNumber & 0xffff;
        }
        #ifndef BEA_LIGHT_DISASSEMBLY
           i += CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand1.OpMnemonic+i, "%.8X",(Int64) MyNumber);
        #endif
        if (GV.OperandSize == 32) {
            GV.EIP_+=7;
        }
        else {
            GV.EIP_+=5;
        }
        pMyDisasm->Instruction.AddrValue = MyAddress + MyNumber;
        FillFlags(pMyDisasm,51);
    }
}